

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O1

PinResult __thiscall
density::detail::PinGuard<density_tests::DeepTestAllocator<65536UL>,_(density::progress_guarantee)0>
::pin(PinGuard<density_tests::DeepTestAllocator<65536UL>,_(density::progress_guarantee)0> *this,
     void *i_address)

{
  PinResult PVar1;
  uintptr_t uint_pointer;
  void *pvVar2;
  long in_FS_OFFSET;
  
  pvVar2 = (void *)((ulong)i_address & 0xffffffffffff0000);
  if (this->m_pinned_page == pvVar2) {
    PVar1 = AlreadyPinned;
  }
  else {
    if (pvVar2 != (void *)0x0) {
      PageAllocator<density::detail::SystemPageManager<65536ul>>::t_instance::__tls_init();
      if (*(long *)(in_FS_OFFSET + -0x88) != 0) {
        PageAllocator<density::detail::SystemPageManager<65536UL>_>::process_pending_unpins_impl
                  (progress_lock_free);
      }
      LOCK();
      *(long *)((long)pvVar2 + 0xfff8U) = *(long *)((long)pvVar2 + 0xfff8U) + 1;
      UNLOCK();
    }
    if (this->m_pinned_page != (void *)0x0) {
      PageAllocator<density::detail::SystemPageManager<65536UL>_>::unpin_page(this->m_pinned_page);
    }
    this->m_pinned_page = pvVar2;
    PVar1 = PinSuccessfull;
  }
  return PVar1;
}

Assistant:

PinResult pin(void * i_address) noexcept
            {
                auto const page = address_lower_align(i_address, ALLOCATOR_TYPE::page_alignment);
                if (page == m_pinned_page)
                {
                    return AlreadyPinned;
                }
                if (ConstConditional(PROGRESS_GUARANTEE == progress_wait_free))
                {
                    if (page != nullptr)
                    {
                        if (!m_allocator->try_pin_page(progress_wait_free, page))
                            return PinFailed;
                    }
                    if (m_pinned_page != nullptr)
                        m_allocator->unpin_page(progress_wait_free, m_pinned_page);
                }
                else
                {
                    if (page != nullptr)
                        m_allocator->pin_page(page);
                    if (m_pinned_page != nullptr)
                        m_allocator->unpin_page(m_pinned_page);
                }
                m_pinned_page = page;
                return PinSuccessfull;
            }